

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationtailoring.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationTailoring::ensureOwnedData(CollationTailoring *this,UErrorCode *errorCode)

{
  UBool UVar1;
  Normalizer2Impl *nfc;
  CollationData *this_00;
  UErrorCode *size;
  CollationData *local_58;
  Normalizer2Impl *nfcImpl;
  UErrorCode *errorCode_local;
  CollationTailoring *this_local;
  
  size = errorCode;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return '\0';
  }
  if (this->ownedData == (CollationData *)0x0) {
    nfc = Normalizer2Factory::getNFCImpl(errorCode);
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 != '\0') {
      return '\0';
    }
    this_00 = (CollationData *)UMemory::operator_new((UMemory *)0x90,(size_t)size);
    local_58 = (CollationData *)0x0;
    if (this_00 != (CollationData *)0x0) {
      CollationData::CollationData(this_00,nfc);
      local_58 = this_00;
    }
    this->ownedData = local_58;
    if (this->ownedData == (CollationData *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      return '\0';
    }
  }
  this->data = this->ownedData;
  return '\x01';
}

Assistant:

UBool
CollationTailoring::ensureOwnedData(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    if(ownedData == NULL) {
        const Normalizer2Impl *nfcImpl = Normalizer2Factory::getNFCImpl(errorCode);
        if(U_FAILURE(errorCode)) { return FALSE; }
        ownedData = new CollationData(*nfcImpl);
        if(ownedData == NULL) {
            errorCode = U_MEMORY_ALLOCATION_ERROR;
            return FALSE;
        }
    }
    data = ownedData;
    return TRUE;
}